

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_unit.cpp
# Opt level: O3

void anon_unknown.dwarf_7e6f::test_art_iterator_lower_bound(void **param_1)

{
  _Bool _Var1;
  allocator_type *paVar2;
  ulong uVar3;
  pointer pVVar4;
  initializer_list<const_char_*> __l;
  initializer_list<(anonymous_namespace)::Value> __l_00;
  initializer_list<const_char_*> __l_01;
  initializer_list<(anonymous_namespace)::Value> __l_02;
  initializer_list<const_char_*> __l_03;
  initializer_list<(anonymous_namespace)::Value> __l_04;
  art_t art;
  vector<const_char_*,_std::allocator<const_char_*>_> keys;
  vector<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_> values;
  art_iterator_t iterator;
  art_t local_e0;
  vector<const_char_*,_std::allocator<const_char_*>_> local_d8;
  vector<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_> local_c0;
  undefined1 local_a8 [24];
  art_node_t *paStack_90;
  char *local_88;
  art_node_t *local_80;
  art_node_t *local_70;
  art_node_t *local_60;
  
  local_88 = "001005";
  local_a8._16_8_ = "000003";
  paStack_90 = (art_node_t *)0x10c123;
  local_a8._0_8_ = "000001";
  local_a8._8_8_ = "000002";
  paVar2 = (allocator_type *)&local_c0;
  __l._M_len = 5;
  __l._M_array = (iterator)local_a8;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector(&local_d8,__l,paVar2);
  local_a8._8_8_ = (art_val_t *)0x1;
  paStack_90 = (art_node_t *)0x2;
  local_80 = (art_node_t *)0x3;
  local_70 = (art_node_t *)0x4;
  local_60 = (art_node_t *)0x5;
  __l_00._M_len = 5;
  __l_00._M_array = (iterator)local_a8;
  std::vector<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>::vector
            (&local_c0,__l_00,(allocator_type *)paVar2);
  local_e0.root = (art_node_t *)0x0;
  if (local_d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar3 = 0;
    pVVar4 = local_c0.
             super__Vector_base<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      art_insert(&local_e0,
                 (art_key_chunk_t *)
                 local_d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar3],(art_val_t *)pVVar4);
      assert_art_valid((art_t *)&local_e0);
      uVar3 = uVar3 + 1;
      pVVar4 = pVVar4 + 1;
    } while (uVar3 < (ulong)((long)local_d8.
                                   super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)local_d8.
                                   super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                   _M_impl.super__Vector_impl_data._M_start >> 3));
  }
  art_init_iterator((art_iterator_t *)local_a8,&local_e0,true);
  _Var1 = art_iterator_lower_bound
                    ((art_iterator_t *)local_a8,
                     (art_key_chunk_t *)
                     local_d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                     _M_impl.super__Vector_impl_data._M_start[2]);
  _assert_true((ulong)_Var1,"art_iterator_lower_bound(&iterator, (art_key_chunk_t*)keys[2])",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/art_unit.cpp"
               ,0x14f);
  assert_key_eq(local_a8,(art_key_chunk_t *)
                         local_d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                         _M_impl.super__Vector_impl_data._M_start[2]);
  _Var1 = art_iterator_lower_bound((art_iterator_t *)local_a8,(art_key_chunk_t *)"000005");
  _assert_true((ulong)_Var1,"art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/art_unit.cpp"
               ,0x152);
  assert_key_eq(local_a8,(art_key_chunk_t *)
                         local_d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                         _M_impl.super__Vector_impl_data._M_start[4]);
  art_free(&local_e0);
  if (local_c0.
      super__Vector_base<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c0.
                    super__Vector_base<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  local_a8._16_8_ = "000004";
  paStack_90 = (art_node_t *)0x10c12a;
  local_a8._0_8_ = "000001";
  local_a8._8_8_ = "000003";
  paVar2 = (allocator_type *)&local_c0;
  __l_01._M_len = 4;
  __l_01._M_array = (iterator)local_a8;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector(&local_d8,__l_01,paVar2);
  local_a8._8_8_ = (art_val_t *)0x1;
  paStack_90 = (art_node_t *)0x3;
  local_80 = (art_node_t *)0x4;
  local_70 = (art_node_t *)0x5;
  __l_02._M_len = 4;
  __l_02._M_array = (iterator)local_a8;
  std::vector<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>::vector
            (&local_c0,__l_02,(allocator_type *)paVar2);
  local_e0.root = (art_node_t *)0x0;
  if (local_d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar3 = 0;
    pVVar4 = local_c0.
             super__Vector_base<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      art_insert(&local_e0,
                 (art_key_chunk_t *)
                 local_d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar3],(art_val_t *)pVVar4);
      assert_art_valid((art_t *)&local_e0);
      uVar3 = uVar3 + 1;
      pVVar4 = pVVar4 + 1;
    } while (uVar3 < (ulong)((long)local_d8.
                                   super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)local_d8.
                                   super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                   _M_impl.super__Vector_impl_data._M_start >> 3));
  }
  art_init_iterator((art_iterator_t *)local_a8,&local_e0,true);
  _Var1 = art_iterator_lower_bound((art_iterator_t *)local_a8,(art_key_chunk_t *)"000002");
  _assert_true((ulong)_Var1,"art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key1)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/art_unit.cpp"
               ,0x164);
  assert_key_eq(local_a8,(art_key_chunk_t *)
                         local_d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                         _M_impl.super__Vector_impl_data._M_start[1]);
  _Var1 = art_iterator_lower_bound((art_iterator_t *)local_a8,(art_key_chunk_t *)"000001");
  _assert_true((ulong)_Var1,"art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key2)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/art_unit.cpp"
               ,0x16a);
  assert_key_eq(local_a8,(art_key_chunk_t *)
                         *local_d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  art_free(&local_e0);
  if (local_c0.
      super__Vector_base<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c0.
                    super__Vector_base<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  local_a8._16_8_ = "000300";
  local_a8._0_8_ = "000100";
  local_a8._8_8_ = "000200";
  paVar2 = (allocator_type *)&local_c0;
  __l_03._M_len = 3;
  __l_03._M_array = (iterator)local_a8;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector(&local_d8,__l_03,paVar2);
  local_a8._8_8_ = (art_val_t *)0x1;
  paStack_90 = (art_node_t *)0x2;
  local_80 = (art_node_t *)0x3;
  __l_04._M_len = 3;
  __l_04._M_array = (iterator)local_a8;
  std::vector<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>::vector
            (&local_c0,__l_04,(allocator_type *)paVar2);
  local_e0.root = (art_node_t *)0x0;
  if (local_d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar3 = 0;
    pVVar4 = local_c0.
             super__Vector_base<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      art_insert(&local_e0,
                 (art_key_chunk_t *)
                 local_d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar3],(art_val_t *)pVVar4);
      assert_art_valid((art_t *)&local_e0);
      uVar3 = uVar3 + 1;
      pVVar4 = pVVar4 + 1;
    } while (uVar3 < (ulong)((long)local_d8.
                                   super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)local_d8.
                                   super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                   _M_impl.super__Vector_impl_data._M_start >> 3));
  }
  art_init_iterator((art_iterator_t *)local_a8,&local_e0,true);
  _Var1 = art_iterator_lower_bound((art_iterator_t *)local_a8,(art_key_chunk_t *)"000201");
  _assert_true((ulong)_Var1,"art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/art_unit.cpp"
               ,0x17e);
  assert_key_eq(local_a8,(art_key_chunk_t *)
                         local_d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                         _M_impl.super__Vector_impl_data._M_start[2]);
  _Var1 = art_iterator_lower_bound((art_iterator_t *)local_a8,(art_key_chunk_t *)"000099");
  _assert_true((ulong)_Var1,"art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/art_unit.cpp"
               ,0x185);
  assert_key_eq(local_a8,(art_key_chunk_t *)
                         *local_d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  _Var1 = art_iterator_lower_bound((art_iterator_t *)local_a8,(art_key_chunk_t *)"000300");
  _assert_true((ulong)_Var1,"art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/art_unit.cpp"
               ,0x18c);
  assert_key_eq(local_a8,(art_key_chunk_t *)
                         local_d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                         _M_impl.super__Vector_impl_data._M_start[2]);
  _Var1 = art_iterator_next((art_iterator_t *)local_a8);
  _assert_true((ulong)!_Var1,"art_iterator_next(&iterator)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/art_unit.cpp"
               ,0x18e);
  _Var1 = art_iterator_lower_bound((art_iterator_t *)local_a8,(art_key_chunk_t *)"000300");
  _assert_true((ulong)_Var1,"art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/art_unit.cpp"
               ,400);
  assert_key_eq(local_a8,(art_key_chunk_t *)
                         local_d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                         _M_impl.super__Vector_impl_data._M_start[2]);
  _Var1 = art_iterator_lower_bound((art_iterator_t *)local_a8,(art_key_chunk_t *)"000100");
  _assert_true((ulong)_Var1,"art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/art_unit.cpp"
               ,0x197);
  assert_key_eq(local_a8,(art_key_chunk_t *)
                         *local_d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  _Var1 = art_iterator_prev((art_iterator_t *)local_a8);
  _assert_true((ulong)!_Var1,"art_iterator_prev(&iterator)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/art_unit.cpp"
               ,0x199);
  _Var1 = art_iterator_lower_bound((art_iterator_t *)local_a8,(art_key_chunk_t *)"000100");
  _assert_true((ulong)_Var1,"art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/art_unit.cpp"
               ,0x19b);
  assert_key_eq(local_a8,(art_key_chunk_t *)
                         *local_d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  art_free(&local_e0);
  if (local_c0.
      super__Vector_base<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c0.
                    super__Vector_base<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  local_d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x1;
  local_c0.
  super__Vector_base<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  art_insert((art_t *)&local_c0,(art_key_chunk_t *)"000001",(art_val_t *)&local_d8);
  art_init_iterator((art_iterator_t *)local_a8,(art_t *)&local_c0,true);
  _Var1 = art_iterator_lower_bound((art_iterator_t *)local_a8,(art_key_chunk_t *)"000001");
  _assert_true((ulong)_Var1,"art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key1)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/art_unit.cpp"
               ,0x1ab);
  assert_key_eq((art_key_chunk_t *)local_a8,(art_key_chunk_t *)"000001");
  _Var1 = art_iterator_lower_bound((art_iterator_t *)local_a8,(art_key_chunk_t *)"000000");
  _assert_true((ulong)_Var1,"art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key2)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/art_unit.cpp"
               ,0x1b0);
  assert_key_eq((art_key_chunk_t *)local_a8,(art_key_chunk_t *)"000001");
  _Var1 = art_iterator_lower_bound((art_iterator_t *)local_a8,(art_key_chunk_t *)"000002");
  _assert_true((ulong)!_Var1,"art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key3)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/art_unit.cpp"
               ,0x1b5);
  art_free((art_t *)&local_c0);
  return;
}

Assistant:

DEFINE_TEST(test_art_iterator_lower_bound) {
    {
        std::vector<const char*> keys = {
            "000001", "000002", "000003", "000004", "001005",
        };
        std::vector<Value> values = {{1}, {2}, {3}, {4}, {5}};
        art_t art{NULL};
        for (size_t i = 0; i < keys.size(); ++i) {
            art_insert(&art, (art_key_chunk_t*)keys[i], &values[i]);
            assert_art_valid(&art);
        }

        art_iterator_t iterator = art_init_iterator(&art, true);
        assert_true(
            art_iterator_lower_bound(&iterator, (art_key_chunk_t*)keys[2]));
        assert_key_eq(iterator.key, (art_key_chunk_t*)keys[2]);
        const char* key = "000005";
        assert_true(art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key));
        assert_key_eq(iterator.key, (art_key_chunk_t*)keys[4]);
        art_free(&art);
    }
    {
        // Lower bound search within a node's children.
        std::vector<const char*> keys = {"000001", "000003", "000004",
                                         "001005"};
        std::vector<Value> values = {{1}, {3}, {4}, {5}};
        art_t art{NULL};
        for (size_t i = 0; i < keys.size(); ++i) {
            art_insert(&art, (art_key_chunk_t*)keys[i], &values[i]);
            assert_art_valid(&art);
        }
        art_iterator_t iterator = art_init_iterator(&art, true);

        const char* key1 = "000002";
        assert_true(
            art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key1));
        assert_key_eq(iterator.key, (art_key_chunk_t*)keys[1]);

        // Check that we can go backward within a node's children.
        const char* key2 = "000001";
        assert_true(
            art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key2));
        assert_key_eq(iterator.key, (art_key_chunk_t*)keys[0]);

        art_free(&art);
    }
    {
        // Lower bound search with leaf where prefix is equal but full key is
        // smaller.
        std::vector<const char*> keys = {"000100", "000200", "000300"};
        std::vector<Value> values = {{1}, {2}, {3}};
        art_t art{NULL};
        for (size_t i = 0; i < keys.size(); ++i) {
            art_insert(&art, (art_key_chunk_t*)keys[i], &values[i]);
            assert_art_valid(&art);
        }
        art_iterator_t iterator = art_init_iterator(&art, true);

        {
            const char* key = "000201";
            assert_true(
                art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key));
            assert_key_eq(iterator.key, (art_key_chunk_t*)keys[2]);
        }
        {
            // Check that we can go backward.
            const char* key = "000099";
            assert_true(
                art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key));
            assert_key_eq(iterator.key, (art_key_chunk_t*)keys[0]);
        }
        {
            // Check that we can go backward from after the end.
            const char* key = "000300";
            assert_true(
                art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key));
            assert_key_eq(iterator.key, (art_key_chunk_t*)keys[2]);
            assert_false(art_iterator_next(&iterator));
            assert_true(
                art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key));
            assert_key_eq(iterator.key, (art_key_chunk_t*)keys[2]);
        }
        {
            // Check that we can go forward from before the start.
            const char* key = "000100";
            assert_true(
                art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key));
            assert_key_eq(iterator.key, (art_key_chunk_t*)keys[0]);
            assert_false(art_iterator_prev(&iterator));
            assert_true(
                art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key));
            assert_key_eq(iterator.key, (art_key_chunk_t*)keys[0]);
        }

        art_free(&art);
    }
    {
        // Lower bound search with only a single leaf.
        const char* key1 = "000001";
        Value value{1};
        art_t art{NULL};
        art_insert(&art, (art_key_chunk_t*)key1, &value);

        art_iterator_t iterator = art_init_iterator(&art, true);

        assert_true(
            art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key1));
        assert_key_eq(iterator.key, (art_key_chunk_t*)key1);

        const char* key2 = "000000";
        assert_true(
            art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key2));
        assert_key_eq(iterator.key, (art_key_chunk_t*)key1);

        const char* key3 = "000002";
        assert_false(
            art_iterator_lower_bound(&iterator, (art_key_chunk_t*)key3));

        art_free(&art);
    }
}